

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimate_halfway.cc
# Opt level: O0

int main(void)

{
  _Setprecision _Var1;
  sample *__first;
  sample *__last;
  ostream *poVar2;
  double __x;
  double dVar3;
  double dVar4;
  uint uStack_2716c;
  double dStack_27168;
  uint i_1;
  double accum;
  double halfway_point;
  double half_sum;
  sample this_sample;
  double p_x;
  double sin_x;
  double x;
  double dStack_27120;
  uint i;
  double sum;
  sample samples [10000];
  uint N;
  
  dStack_27120 = 0.0;
  for (x._4_4_ = 0; x._4_4_ < 10000; x._4_4_ = x._4_4_ + 1) {
    __x = random_double(0.0,6.283185307179586);
    dVar3 = sin(__x);
    dVar4 = exp(-__x / 6.283185307179586);
    dVar3 = dVar4 * dVar3 * dVar3;
    dStack_27120 = dVar3 + dStack_27120;
    samples[(ulong)x._4_4_ - 1].p_x = __x;
    samples[x._4_4_].x = dVar3;
  }
  __first = std::begin<sample,10000ul>((sample (*) [10000])&sum);
  __last = std::end<sample,10000ul>((sample (*) [10000])&sum);
  std::sort<sample*,bool(*)(sample_const&,sample_const&)>(__first,__last,compare_by_x);
  accum = 0.0;
  dStack_27168 = 0.0;
  uStack_2716c = 0;
  do {
    if (9999 < uStack_2716c) {
LAB_001017ab:
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
      _Var1 = std::setprecision(0xc);
      std::operator<<(poVar2,_Var1);
      poVar2 = std::operator<<((ostream *)&std::cout,"Average = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dStack_27120 / 10000.0);
      std::operator<<(poVar2,'\n');
      poVar2 = std::operator<<((ostream *)&std::cout,"Area under curve = ");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,(dStack_27120 * 6.283185307179586) / 10000.0);
      std::operator<<(poVar2,'\n');
      poVar2 = std::operator<<((ostream *)&std::cout,"Halfway = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,accum);
      std::operator<<(poVar2,'\n');
      return 0;
    }
    dStack_27168 = samples[uStack_2716c].x + dStack_27168;
    if (dStack_27120 / 2.0 <= dStack_27168) {
      accum = samples[(ulong)uStack_2716c - 1].p_x;
      goto LAB_001017ab;
    }
    uStack_2716c = uStack_2716c + 1;
  } while( true );
}

Assistant:

int main() {
    const unsigned int N = 10000;
    sample samples[N];
    double sum = 0.0;

    // Iterate through all of our samples.

    for (unsigned int i = 0; i < N; i++) {
        // Get the area under the curve.
        auto x = random_double(0, 2*pi);
        auto sin_x = std::sin(x);
        auto p_x = exp(-x / (2*pi)) * sin_x * sin_x;
        sum += p_x;

        // Store this sample.
        sample this_sample = {x, p_x};
        samples[i] = this_sample;
    }

    // Sort the samples by x.
    std::sort(std::begin(samples), std::end(samples), compare_by_x);

    // Find out the sample at which we have half of our area.
    double half_sum = sum / 2.0;
    double halfway_point = 0.0;
    double accum = 0.0;
    for (unsigned int i = 0; i < N; i++){
        accum += samples[i].p_x;
        if (accum >= half_sum) {
            halfway_point = samples[i].x;
            break;
        }
    }

    std::cout << std::fixed << std::setprecision(12);
    std::cout << "Average = " << sum / N << '\n';
    std::cout << "Area under curve = " << 2 * pi * sum / N << '\n';
    std::cout << "Halfway = " << halfway_point << '\n';
}